

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::analysis::DefUseManager::NumUses(DefUseManager *this,Instruction *def)

{
  anon_class_8_1_a7c1402f local_48;
  function<void_(spvtools::opt::Instruction_*,_unsigned_int)> local_40;
  uint32_t local_1c;
  Instruction *pIStack_18;
  uint32_t count;
  Instruction *def_local;
  DefUseManager *this_local;
  
  local_1c = 0;
  local_48.count = &local_1c;
  pIStack_18 = def;
  def_local = (Instruction *)this;
  std::function<void(spvtools::opt::Instruction*,unsigned_int)>::
  function<spvtools::opt::analysis::DefUseManager::NumUses(spvtools::opt::Instruction_const*)const::__0,void>
            ((function<void(spvtools::opt::Instruction*,unsigned_int)> *)&local_40,&local_48);
  ForEachUse(this,def,&local_40);
  std::function<void_(spvtools::opt::Instruction_*,_unsigned_int)>::~function(&local_40);
  return local_1c;
}

Assistant:

uint32_t DefUseManager::NumUses(const Instruction* def) const {
  uint32_t count = 0;
  ForEachUse(def, [&count](Instruction*, uint32_t) { ++count; });
  return count;
}